

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O2

void compact_wo_reopen_test(void)

{
  void *pvVar1;
  fdb_doc *pfVar2;
  void *pvVar3;
  fdb_doc *doc;
  fdb_status fVar4;
  int iVar5;
  size_t keylen;
  size_t metalen;
  size_t bodylen;
  ulong uVar6;
  char *__format;
  long lVar7;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db_new;
  fdb_file_handle *dbfile_new;
  fdb_doc *pfStack_4b8;
  size_t *local_4b0;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_file_info info;
  fdb_config fconfig;
  char metabuf [256];
  char keybuf [256];
  char bodybuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.buffercache_size = 0x1000000;
  fconfig.wal_threshold = 0x400;
  fconfig.flags = 1;
  fconfig.compaction_threshold = '\0';
  fdb_open(&dbfile,"./compact_test1",&fconfig);
  fdb_kvs_open_default(dbfile,&db,&kvs_config);
  fVar4 = fdb_set_log_callback(db,logCallbackFunc,"compact_wo_reopen_test");
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x118);
    compact_wo_reopen_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x118,"void compact_wo_reopen_test()");
  }
  fdb_open(&dbfile_new,"./compact_test1",&fconfig);
  fdb_kvs_open_default(dbfile_new,&db_new,&kvs_config);
  fVar4 = fdb_set_log_callback(db_new,logCallbackFunc,"compact_wo_reopen_test");
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x11d);
    compact_wo_reopen_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x11d,"void compact_wo_reopen_test()");
  }
  lVar7 = 0;
  for (uVar6 = 0; uVar6 != 3; uVar6 = uVar6 + 1) {
    sprintf(keybuf,"key%d",uVar6 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar6 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar6 & 0xffffffff);
    keylen = strlen(keybuf);
    metalen = strlen(metabuf);
    bodylen = strlen(bodybuf);
    fdb_doc_create((fdb_doc **)((long)&pfStack_4b8 + lVar7),keybuf,keylen,metabuf,metalen,bodybuf,
                   bodylen);
    fdb_set(db,(&pfStack_4b8)[uVar6]);
    lVar7 = lVar7 + 8;
  }
  lVar7 = 0;
  fdb_doc_create(&rdoc,(void *)local_4b0[4],*local_4b0,(void *)local_4b0[7],local_4b0[1],(void *)0x0
                 ,0);
  rdoc->deleted = true;
  fdb_set(db,rdoc);
  fdb_doc_free(rdoc);
  fdb_commit(dbfile,'\x01');
  fdb_compact(dbfile,"./compact_test2");
  do {
    if (lVar7 == 3) {
      fdb_get_file_info(dbfile_new,&info);
      iVar5 = strcmp("./compact_test2",info.filename);
      if (iVar5 != 0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x149);
        compact_wo_reopen_test()::__test_pass = '\x01';
        iVar5 = strcmp("./compact_test2",info.filename);
        if (iVar5 != 0) {
          __assert_fail("!strcmp(\"./compact_test2\", info.filename)",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x149,"void compact_wo_reopen_test()");
        }
      }
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        fdb_doc_free((&pfStack_4b8)[lVar7]);
      }
      fdb_kvs_close(db);
      fdb_kvs_close(db_new);
      fdb_close(dbfile);
      fdb_close(dbfile_new);
      fdb_shutdown();
      memleak_end();
      __format = "%s PASSED\n";
      if (compact_wo_reopen_test()::__test_pass != '\0') {
        __format = "%s FAILED\n";
      }
      fprintf(_stderr,__format,"compaction without reopen test");
      return;
    }
    fdb_doc_create(&rdoc,(&pfStack_4b8)[lVar7]->key,(&pfStack_4b8)[lVar7]->keylen,(void *)0x0,0,
                   (void *)0x0,0);
    fVar4 = fdb_get(db_new,rdoc);
    doc = rdoc;
    if (lVar7 == 1) {
      if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x140);
        compact_wo_reopen_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x140,"void compact_wo_reopen_test()");
      }
    }
    else {
      if (fVar4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x13c);
        compact_wo_reopen_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x13c,"void compact_wo_reopen_test()");
      }
      pvVar1 = rdoc->meta;
      pfVar2 = (&pfStack_4b8)[lVar7];
      pvVar3 = pfVar2->meta;
      iVar5 = bcmp(pvVar1,pvVar3,rdoc->metalen);
      if (iVar5 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x13d);
        compact_wo_reopen_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x13d,"void compact_wo_reopen_test()");
      }
      pvVar1 = doc->body;
      pvVar3 = pfVar2->body;
      iVar5 = bcmp(pvVar1,pvVar3,doc->bodylen);
      if (iVar5 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x13e);
        compact_wo_reopen_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x13e,"void compact_wo_reopen_test()");
      }
    }
    fdb_doc_free(doc);
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

void compact_wo_reopen_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 3;
    fdb_file_handle *dbfile, *dbfile_new;
    fdb_kvs_handle *db;
    fdb_kvs_handle *db_new;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 16777216;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_wo_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_open(&dbfile_new, "./compact_test1", &fconfig);
    fdb_kvs_open_default(dbfile_new, &db_new, &kvs_config);
    status = fdb_set_log_callback(db_new, logCallbackFunc,
                                  (void *) "compact_wo_reopen_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // remove doc
    fdb_doc_create(&rdoc, doc[1]->key, doc[1]->keylen, doc[1]->meta, doc[1]->metalen, NULL, 0);
    rdoc->deleted = true;
    fdb_set(db, rdoc);
    fdb_doc_free(rdoc);

    // commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // perform compaction using one handle
    fdb_compact(dbfile, (char *) "./compact_test2");

    // retrieve documents using the other handle without close/re-open
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db_new, rdoc);

        if (i != 1) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        }else{
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }

        // free result document
        fdb_doc_free(rdoc);
    }
    // check the other handle's filename
    fdb_file_info info;
    fdb_get_file_info(dbfile_new, &info);
    TEST_CHK(!strcmp("./compact_test2", info.filename));

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // close db file
    fdb_kvs_close(db);
    fdb_kvs_close(db_new);
    fdb_close(dbfile);
    fdb_close(dbfile_new);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("compaction without reopen test");
}